

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffphbn(fitsfile *fptr,LONGLONG naxis2,int tfields,char **ttype,char **tform,char **tunit,
          char *extnmx,LONGLONG pcount,int *status)

{
  long lVar1;
  char **ppcVar2;
  int iVar3;
  FITSfile *pFVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  long value;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  long repeat;
  long width;
  char tfmt [30];
  char name [75];
  char card [81];
  char extnm [71];
  uint local_1cc;
  char local_1c8 [16];
  undefined8 uStack_1b8;
  undefined5 uStack_1b0;
  undefined2 uStack_1ab;
  undefined1 uStack_1a9;
  undefined7 uStack_1a8;
  undefined1 uStack_1a1;
  undefined7 uStack_1a0;
  undefined1 uStack_199;
  ulong local_178;
  long local_170;
  char **local_168;
  char **local_160;
  char **local_158;
  long local_150;
  char local_148 [32];
  char local_128 [80];
  char local_d8 [4];
  undefined2 auStack_d4 [2];
  char local_d0 [8];
  char acStack_c8 [8];
  char acStack_c0 [8];
  char acStack_b8 [8];
  char acStack_b0 [6];
  undefined8 auStack_aa [6];
  char local_78 [72];
  
  iVar11 = *status;
  if (iVar11 < 1) {
    iVar11 = fptr->HDUposition;
    pFVar4 = fptr->Fptr;
    local_160 = ttype;
    if (iVar11 != pFVar4->curhdu) {
      ffmahd(fptr,iVar11 + 1,(int *)0x0,status);
      pFVar4 = fptr->Fptr;
      iVar11 = pFVar4->curhdu;
    }
    if (pFVar4->headend == pFVar4->headstart[iVar11]) {
      if (naxis2 < 0) {
        *status = 0xda;
        iVar11 = 0xda;
      }
      else if (pcount < 0) {
        *status = 0xd6;
        iVar11 = 0xd6;
      }
      else if ((uint)tfields < 1000) {
        local_78[0] = '\0';
        if (extnmx != (char *)0x0) {
          strncat(local_78,extnmx,0x46);
        }
        local_168 = tunit;
        local_158 = tform;
        ffpkys(fptr,"XTENSION","BINTABLE","binary table extension",status);
        ffpkyj(fptr,"BITPIX",8,"8-bit bytes",status);
        ffpkyj(fptr,"NAXIS",2,"2-dimensional binary table",status);
        local_178 = (ulong)(uint)tfields;
        if (tfields == 0) {
          value = 0;
        }
        else {
          lVar1 = local_178 - 1;
          value = 0;
          lVar12 = 0;
          do {
            ffbnfm(local_158[lVar12],(int *)&local_1cc,&local_170,&local_150,status);
            if (local_1cc == 1) {
              lVar5 = local_170 + 0xe;
              if (-1 < local_170 + 7) {
                lVar5 = local_170 + 7;
              }
              lVar5 = lVar5 >> 3;
            }
            else {
              lVar5 = local_170;
              if (local_1cc != 0x10) {
                if ((int)local_1cc < 1) {
                  lVar5 = 8;
                  if ((byte)(*local_158[lVar12] | 0x20U) != 0x70) {
                    lVar5 = (ulong)((local_158[lVar12][1] + 0xb0U & 0xdf) != 0) * 8 + 8;
                  }
                }
                else {
                  lVar5 = ((ulong)local_1cc / 10) * local_170;
                }
              }
            }
            value = value + lVar5;
          } while ((*status < 1) && (bVar14 = lVar1 != lVar12, lVar12 = lVar12 + 1, bVar14));
        }
        ffpkyj(fptr,"NAXIS1",value,"width of table in bytes",status);
        ffpkyj(fptr,"NAXIS2",naxis2,"number of rows in table",status);
        ffpkyj(fptr,"PCOUNT",0,"size of special data area",status);
        ffpkyj(fptr,"GCOUNT",1,"one data group (required keyword)",status);
        uVar9 = local_178;
        ffpkyj(fptr,"TFIELDS",local_178,"number of fields in each row",status);
        uVar13 = 0;
        do {
          ppcVar2 = local_160;
          if (uVar13 == uVar9) break;
          if (*local_160[uVar13] != '\0') {
            uVar10 = (int)uVar13 + 1;
            snprintf(local_1c8,0x49,"label for field %3d",(ulong)uVar10);
            ffkeyn("TTYPE",uVar10,local_128,status);
            ffpkys(fptr,local_128,ppcVar2[uVar13],local_1c8,status);
          }
          pcVar8 = local_158[uVar13];
          sVar6 = strlen(pcVar8);
          if (0x1d < sVar6) {
            ffpmsg("Error: BIN table TFORM code is too long (ffphbn)");
            *status = 0x105;
            break;
          }
          strcpy(local_148,pcVar8);
          ffupch(local_148);
          iVar11 = (int)(uVar13 + 1);
          ffkeyn("TFORM",iVar11,local_128,status);
          uStack_1b8._0_4_ = 0x646c6569;
          uStack_1b8._4_4_ = uStack_1b8._4_4_ & 0xffffff00;
          builtin_strncpy(local_1c8,"data format of f",0x10);
          ffbnfm(local_148,(int *)&local_1cc,&local_170,&local_150,status);
          uVar9 = local_178;
          if (0x28 < (int)local_1cc) {
            if (0x4f < (int)local_1cc) {
              switch(local_1cc) {
              case 0x50:
              case 0x51:
                sVar6 = strlen(local_1c8);
                uVar15._0_1_ = ':';
                uVar15._1_1_ = ' ';
                uVar15._2_1_ = '8';
                uVar15._3_1_ = '-';
                uVar18._0_1_ = 'b';
                uVar18._1_1_ = 'y';
                uVar18._2_1_ = 't';
                uVar18._3_1_ = 'e';
                uVar21._0_1_ = ' ';
                uVar21._1_1_ = 'I';
                uVar21._2_1_ = 'N';
                uVar21._3_1_ = 'T';
                uVar23._0_1_ = 'E';
                uVar23._1_1_ = 'G';
                uVar23._2_1_ = 'E';
                uVar23._3_1_ = 'R';
                break;
              case 0x52:
                sVar6 = strlen(local_1c8);
                uVar16._0_1_ = ':';
                uVar16._1_1_ = ' ';
                uVar16._2_1_ = '8';
                uVar16._3_1_ = '-';
                uVar19._0_1_ = 'b';
                uVar19._1_1_ = 'y';
                uVar19._2_1_ = 't';
                uVar19._3_1_ = 'e';
                uVar22._0_1_ = ' ';
                uVar22._1_1_ = 'D';
                uVar22._2_1_ = 'O';
                uVar22._3_1_ = 'U';
                uVar24._0_1_ = 'B';
                uVar24._1_1_ = 'L';
                uVar24._2_1_ = 'E';
                uVar24._3_1_ = '\0';
                goto LAB_001a798d;
              case 0x53:
                sVar6 = strlen(local_1c8);
                builtin_strncpy(local_1c8 + sVar6,": COMPLEX",10);
                goto LAB_001a752b;
              default:
                if (local_1cc != 0xa3) goto switchD_001a7426_caseD_c;
                sVar6 = strlen(local_1c8);
                uVar15._0_1_ = ':';
                uVar15._1_1_ = ' ';
                uVar15._2_1_ = 'D';
                uVar15._3_1_ = 'O';
                uVar18._0_1_ = 'U';
                uVar18._1_1_ = 'B';
                uVar18._2_1_ = 'L';
                uVar18._3_1_ = 'E';
                uVar21._0_1_ = ' ';
                uVar21._1_1_ = 'C';
                uVar21._2_1_ = 'O';
                uVar21._3_1_ = 'M';
                uVar23._0_1_ = 'P';
                uVar23._1_1_ = 'L';
                uVar23._2_1_ = 'E';
                uVar23._3_1_ = 'X';
              }
              goto LAB_001a7521;
            }
            if (local_1cc == 0x29) {
LAB_001a74ba:
              sVar6 = strlen(local_1c8);
              uVar15._0_1_ = ':';
              uVar15._1_1_ = ' ';
              uVar15._2_1_ = '4';
              uVar15._3_1_ = '-';
              uVar18._0_1_ = 'b';
              uVar18._1_1_ = 'y';
              uVar18._2_1_ = 't';
              uVar18._3_1_ = 'e';
              uVar21._0_1_ = ' ';
              uVar21._1_1_ = 'I';
              uVar21._2_1_ = 'N';
              uVar21._3_1_ = 'T';
              uVar23._0_1_ = 'E';
              uVar23._1_1_ = 'G';
              uVar23._2_1_ = 'E';
              uVar23._3_1_ = 'R';
              goto LAB_001a7521;
            }
            if (local_1cc != 0x2a) goto switchD_001a7426_caseD_c;
            sVar6 = strlen(local_1c8);
            builtin_strncpy(local_1c8 + sVar6,": 4-byte REAL",0xe);
            goto LAB_001a752b;
          }
          switch(local_1cc) {
          case 0xb:
            sVar6 = strlen(local_1c8);
            builtin_strncpy(local_1c8 + sVar6,": BYTE",7);
            break;
          case 0xc:
          case 0xd:
          case 0xf:
          case 0x11:
          case 0x12:
          case 0x13:
switchD_001a7426_caseD_c:
            if ((int)local_1cc < 0) {
              sVar6 = strlen(local_1c8);
              *(undefined8 *)((long)&uStack_1b8 + sVar6) = 0x79617272612068;
              uVar16._0_1_ = ':';
              uVar16._1_1_ = ' ';
              uVar16._2_1_ = 'v';
              uVar16._3_1_ = 'a';
              uVar19._0_1_ = 'r';
              uVar19._1_1_ = 'i';
              uVar19._2_1_ = 'a';
              uVar19._3_1_ = 'b';
              uVar22._0_1_ = 'l';
              uVar22._1_1_ = 'e';
              uVar22._2_1_ = ' ';
              uVar22._3_1_ = 'l';
              uVar24._0_1_ = 'e';
              uVar24._1_1_ = 'n';
              uVar24._2_1_ = 'g';
              uVar24._3_1_ = 't';
LAB_001a798d:
              *(undefined4 *)(local_1c8 + sVar6) = uVar16;
              *(undefined4 *)(local_1c8 + sVar6 + 4) = uVar19;
              *(undefined4 *)(local_1c8 + sVar6 + 8) = uVar22;
              *(undefined4 *)(local_1c8 + sVar6 + 0xc) = uVar24;
            }
            break;
          case 0xe:
            sVar6 = strlen(local_1c8);
            uVar15._0_1_ = ':';
            uVar15._1_1_ = ' ';
            uVar15._2_1_ = '1';
            uVar15._3_1_ = '-';
            uVar18._0_1_ = 'b';
            uVar18._1_1_ = 'y';
            uVar18._2_1_ = 't';
            uVar18._3_1_ = 'e';
            uVar21._0_1_ = ' ';
            uVar21._1_1_ = 'L';
            uVar21._2_1_ = 'O';
            uVar21._3_1_ = 'G';
            uVar23._0_1_ = 'I';
            uVar23._1_1_ = 'C';
            uVar23._2_1_ = 'A';
            uVar23._3_1_ = 'L';
            goto LAB_001a7521;
          case 0x10:
            sVar6 = strlen(local_1c8);
            builtin_strncpy(local_1c8 + sVar6,": ASCII Characte",0x10);
            *(undefined2 *)((long)&uStack_1b8 + sVar6) = 0x72;
            pcVar8 = strchr(local_148,0x41);
            iVar3 = __isoc99_sscanf(pcVar8 + 1,"%ld",&local_150);
            if ((iVar3 == 1) && (local_170 < local_150)) {
              if (local_170 == 1) {
                uStack_1a8 = 0x494d2059422058;
                uStack_1a1 = 0x53;
                uStack_1a0 = 0x3f3f454b4154;
                uStack_1b8._0_4_ = 0x49494353;
                uStack_1b8._4_4_ = 0x42415420;
                uStack_1b0 = 0x595320454c;
                uStack_1ab = 0x544e;
                uStack_1a9 = 0x41;
                uVar17._0_1_ = 'E';
                uVar17._1_1_ = 'R';
                uVar17._2_1_ = 'R';
                uVar17._3_1_ = 'O';
                uVar20._0_1_ = 'R';
                uVar20._1_1_ = '?';
                uVar20._2_1_ = '?';
                uVar20._3_1_ = ' ';
                local_1c8[8] = ' ';
                local_1c8[9] = 'U';
                local_1c8[10] = 'S';
                local_1c8[0xb] = 'I';
                local_1c8[0xc] = 'N';
                local_1c8[0xd] = 'G';
                local_1c8[0xe] = ' ';
                local_1c8[0xf] = 'A';
              }
              else {
                uStack_1a8 = 0x4e4d554c4f4320;
                uStack_1a1 = 0x20;
                uStack_1a0 = 0x72204854444957;
                uStack_199 = 0;
                uStack_1b8._0_4_ = 0x4e552021;
                uStack_1b8._4_4_ = 0x57205449;
                uStack_1b0 = 0x2048544449;
                uStack_1ab = 0x2077;
                uStack_1a9 = 0x3e;
                uVar17._0_1_ = 'r';
                uVar17._1_1_ = 'A';
                uVar17._2_1_ = 'w';
                uVar17._3_1_ = ' ';
                uVar20._0_1_ = 'F';
                uVar20._1_1_ = 'O';
                uVar20._2_1_ = 'R';
                uVar20._3_1_ = 'M';
                local_1c8[8] = 'A';
                local_1c8[9] = 'T';
                local_1c8[10] = ' ';
                local_1c8[0xb] = 'E';
                local_1c8[0xc] = 'R';
                local_1c8[0xd] = 'R';
                local_1c8[0xe] = 'O';
                local_1c8[0xf] = 'R';
              }
              local_1c8[4] = (char)uVar20;
              local_1c8[5] = SUB41(uVar20,1);
              local_1c8[6] = SUB41(uVar20,2);
              local_1c8[7] = SUB41(uVar20,3);
              local_1c8[0] = (char)uVar17;
              local_1c8[1] = SUB41(uVar17,1);
              local_1c8[2] = SUB41(uVar17,2);
              local_1c8[3] = SUB41(uVar17,3);
            }
            break;
          case 0x14:
          case 0x15:
            sVar6 = strlen(local_1c8);
            uVar15._0_1_ = ':';
            uVar15._1_1_ = ' ';
            uVar15._2_1_ = '2';
            uVar15._3_1_ = '-';
            uVar18._0_1_ = 'b';
            uVar18._1_1_ = 'y';
            uVar18._2_1_ = 't';
            uVar18._3_1_ = 'e';
            uVar21._0_1_ = ' ';
            uVar21._1_1_ = 'I';
            uVar21._2_1_ = 'N';
            uVar21._3_1_ = 'T';
            uVar23._0_1_ = 'E';
            uVar23._1_1_ = 'G';
            uVar23._2_1_ = 'E';
            uVar23._3_1_ = 'R';
LAB_001a7521:
            *(undefined4 *)(local_1c8 + sVar6) = uVar15;
            *(undefined4 *)(local_1c8 + sVar6 + 4) = uVar18;
            *(undefined4 *)(local_1c8 + sVar6 + 8) = uVar21;
            *(undefined4 *)(local_1c8 + sVar6 + 0xc) = uVar23;
            *(undefined1 *)((long)&uStack_1b8 + sVar6) = 0;
            break;
          default:
            if (local_1cc != 1) {
              if (local_1cc == 0x28) goto LAB_001a74ba;
              goto switchD_001a7426_caseD_c;
            }
            sVar6 = strlen(local_1c8);
            builtin_strncpy(local_1c8 + sVar6,": BIT",6);
          }
LAB_001a752b:
          uVar10 = -local_1cc;
          if (0 < (int)local_1cc) {
            uVar10 = local_1cc;
          }
          if ((int)uVar10 < 0x28) {
            if (uVar10 == 0xc) {
              pcVar8 = local_148;
              do {
                pcVar7 = pcVar8;
                pcVar8 = pcVar7 + 1;
              } while (*pcVar7 != 'S');
              *pcVar7 = 'B';
              ffpkys(fptr,local_128,local_148,local_1c8,status);
              ffkeyn("TZERO",iVar11,local_128,status);
              uStack_1b8._0_4_ = 0x79622064;
              uStack_1b8._4_4_ = 0x736574;
              builtin_strncpy(local_1c8 + 8,"or signe",8);
              uVar10 = 0xc0600000;
LAB_001a7806:
              builtin_strncpy(local_1c8,"offset f",8);
              ffpkyg(fptr,local_128,(double)((ulong)uVar10 << 0x20),0,local_1c8,status);
              ffkeyn("TSCAL",iVar11,local_128,status);
              goto LAB_001a784f;
            }
            if (uVar10 == 0x14) {
              pcVar8 = local_148;
              do {
                pcVar7 = pcVar8;
                pcVar8 = pcVar7 + 1;
              } while (*pcVar7 != 'U');
              *pcVar7 = 'I';
              ffpkys(fptr,local_128,local_148,local_1c8,status);
              ffkeyn("TZERO",iVar11,local_128,status);
              builtin_strncpy(local_1c8 + 8,"or unsig",8);
              uStack_1b8._0_4_ = 0x2064656e;
              uStack_1b8._4_4_ = 0x65746e69;
              uStack_1b0 = 0x73726567;
              uVar10 = 0x40e00000;
              goto LAB_001a7806;
            }
LAB_001a76f0:
            ffpkys(fptr,local_128,local_148,local_1c8,status);
          }
          else {
            if (uVar10 == 0x28) {
              pcVar8 = local_148;
              do {
                pcVar7 = pcVar8;
                pcVar8 = pcVar7 + 1;
              } while (*pcVar7 != 'V');
              *pcVar7 = 'J';
              ffpkys(fptr,local_128,local_148,local_1c8,status);
              ffkeyn("TZERO",iVar11,local_128,status);
              builtin_strncpy(local_1c8 + 8,"or unsig",8);
              uStack_1b8._0_4_ = 0x2064656e;
              uStack_1b8._4_4_ = 0x65746e69;
              uStack_1b0 = 0x73726567;
              uVar10 = 0x41e00000;
              goto LAB_001a7806;
            }
            if (uVar10 != 0x50) goto LAB_001a76f0;
            pcVar8 = local_148;
            do {
              pcVar7 = pcVar8;
              pcVar8 = pcVar7 + 1;
            } while (*pcVar7 != 'W');
            *pcVar7 = 'K';
            ffpkys(fptr,local_128,local_148,local_1c8,status);
            ffkeyn("TZERO",iVar11,local_d8,status);
            sVar6 = strlen(local_d8);
            builtin_strncpy(local_d8 + sVar6,"    ",4);
            *(undefined2 *)((long)auStack_d4 + sVar6) = 0x20;
            local_d0[0] = '\0';
            sVar6 = strlen(local_d8);
            *(undefined8 *)((long)auStack_aa + sVar6) = 0x7372656765746e;
            builtin_strncpy(local_d8 + sVar6,"=  92233",8);
            builtin_strncpy(local_d0 + sVar6,"72036854",8);
            builtin_strncpy(acStack_c8 + sVar6,"775808 /",8);
            builtin_strncpy(acStack_c0 + sVar6," offset ",8);
            builtin_strncpy(acStack_b8 + sVar6,"for unsi",8);
            builtin_strncpy(acStack_b0 + sVar6,"gned int",8);
            ffprec(fptr,local_d8,status);
            ffkeyn("TSCAL",iVar11,local_128,status);
LAB_001a784f:
            uStack_1b8._0_4_ = 0x64656c;
            builtin_strncpy(local_1c8,"data are not sca",0x10);
            ffpkyg(fptr,local_128,1.0,0,local_1c8,status);
            uVar9 = local_178;
          }
          if (((local_168 != (char **)0x0) && (local_168[uVar13] != (char *)0x0)) &&
             (*local_168[uVar13] != '\0')) {
            ffkeyn("TUNIT",iVar11,local_128,status);
            ffpkys(fptr,local_128,local_168[uVar13],"physical unit of field",status);
          }
          uVar13 = uVar13 + 1;
        } while (*status < 1);
        if (local_78[0] != '\0') {
          ffpkys(fptr,"EXTNAME",local_78,"name of this binary table extension",status);
        }
        iVar11 = *status;
        if (0 < iVar11) {
          ffpmsg("Failed to write binary table header keywords (ffphbn)");
          iVar11 = *status;
        }
      }
      else {
        *status = 0xd8;
        iVar11 = 0xd8;
      }
    }
    else {
      *status = 0xc9;
      iVar11 = 0xc9;
    }
  }
  return iVar11;
}

Assistant:

int ffphbn(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,   /* I - value of EXTNAME keyword, if any         */
           LONGLONG pcount,     /* I - size of the variable length heap area    */
           int *status)     /* IO - error status                            */
/*
  Put required Header keywords into the Binary Table:
*/
{
    int ii, datatype, iread = 0;
    long repeat, width;
    LONGLONG naxis1;

    char tfmt[30], name[FLEN_KEYWORD], comm[FLEN_COMMENT], extnm[FLEN_VALUE];
    char *cptr, card[FLEN_CARD];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);
    else if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (pcount < 0)
        return(*status = BAD_PCOUNT);
    else if (tfields < 0 || tfields > 999)
        return(*status = BAD_TFIELDS);

    extnm[0] = '\0';
    if (extnmx)
        strncat(extnm, extnmx, FLEN_VALUE-1);

    ffpkys(fptr, "XTENSION", "BINTABLE", "binary table extension", status);
    ffpkyj(fptr, "BITPIX", 8, "8-bit bytes", status);
    ffpkyj(fptr, "NAXIS", 2, "2-dimensional binary table", status);

    naxis1 = 0;
    for (ii = 0; ii < tfields; ii++)  /* sum the width of each field */
    {
        ffbnfm(tform[ii], &datatype, &repeat, &width, status);

        if (datatype == TSTRING)
            naxis1 += repeat;   /* one byte per char */
        else if (datatype == TBIT)
            naxis1 += (repeat + 7) / 8;
        else if (datatype > 0)
            naxis1 += repeat * (datatype / 10);
        else if (tform[ii][0] == 'P' || tform[ii][1] == 'P'||
                 tform[ii][0] == 'p' || tform[ii][1] == 'p')
           /* this is a 'P' variable length descriptor (neg. datatype) */
            naxis1 += 8;
        else
           /* this is a 'Q' variable length descriptor (neg. datatype) */
            naxis1 += 16;

        if (*status > 0)
            break;       /* abort loop on error */
    }

    ffpkyj(fptr, "NAXIS1", naxis1, "width of table in bytes", status);
    ffpkyj(fptr, "NAXIS2", naxis2, "number of rows in table", status);

    /*
      the initial value of PCOUNT (= size of the variable length array heap)
      should always be zero.  If any variable length data is written, then
      the value of PCOUNT will be updated when the HDU is closed
    */
    ffpkyj(fptr, "PCOUNT", 0, "size of special data area", status);
    ffpkyj(fptr, "GCOUNT", 1, "one data group (required keyword)", status);
    ffpkyj(fptr, "TFIELDS", tfields, "number of fields in each row", status);

    for (ii = 0; ii < tfields; ii++) /* loop over every column */
    {
        if ( *(ttype[ii]) )  /* optional TTYPEn keyword */
        {
          snprintf(comm, FLEN_COMMENT,"label for field %3d", ii + 1);
          ffkeyn("TTYPE", ii + 1, name, status);
          ffpkys(fptr, name, ttype[ii], comm, status);
        }

        if (strlen(tform[ii]) > 29)
        {
          ffpmsg("Error: BIN table TFORM code is too long (ffphbn)");
          *status = BAD_TFORM;
          break;
        }
        strcpy(tfmt, tform[ii]);  /* required TFORMn keyword */
        ffupch(tfmt);

        ffkeyn("TFORM", ii + 1, name, status);
        strcpy(comm, "data format of field");

        ffbnfm(tfmt, &datatype, &repeat, &width, status);

        if (datatype == TSTRING)
        {
            strcat(comm, ": ASCII Character");

            /* Do sanity check to see if an ASCII table format was used,  */
            /* e.g., 'A8' instead of '8A', or a bad unit width eg '8A9'.  */
            /* Don't want to return an error status, so write error into  */
            /* the keyword comment.  */

            cptr = strchr(tfmt,'A');
            cptr++;

            if (cptr)
               iread = sscanf(cptr,"%ld", &width);

            if (iread == 1 && (width > repeat)) 
            {
              if (repeat == 1)
                strcpy(comm, "ERROR??  USING ASCII TABLE SYNTAX BY MISTAKE??");
              else
                strcpy(comm, "rAw FORMAT ERROR! UNIT WIDTH w > COLUMN WIDTH r");
            }
        }
        else if (datatype == TBIT)
           strcat(comm, ": BIT");
        else if (datatype == TBYTE)
           strcat(comm, ": BYTE");
        else if (datatype == TLOGICAL)
           strcat(comm, ": 1-byte LOGICAL");
        else if (datatype == TSHORT)
           strcat(comm, ": 2-byte INTEGER");
        else if (datatype == TUSHORT)
           strcat(comm, ": 2-byte INTEGER");
        else if (datatype == TLONG)
           strcat(comm, ": 4-byte INTEGER");
        else if (datatype == TLONGLONG)
           strcat(comm, ": 8-byte INTEGER");
        else if (datatype == TULONG)
           strcat(comm, ": 4-byte INTEGER");
        else if (datatype == TULONGLONG)
           strcat(comm, ": 8-byte INTEGER");
        else if (datatype == TFLOAT)
           strcat(comm, ": 4-byte REAL");
        else if (datatype == TDOUBLE)
           strcat(comm, ": 8-byte DOUBLE");
        else if (datatype == TCOMPLEX)
           strcat(comm, ": COMPLEX");
        else if (datatype == TDBLCOMPLEX)
           strcat(comm, ": DOUBLE COMPLEX");
        else if (datatype < 0)
           strcat(comm, ": variable length array");

        if (abs(datatype) == TSBYTE) /* signed bytes */
        {
           /* Replace the 'S' with an 'B' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'S') 
              cptr++;

           *cptr = 'B';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for signed bytes");

           ffpkyg(fptr, name, -128., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TUSHORT) 
        {
           /* Replace the 'U' with an 'I' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'U') 
              cptr++;

           *cptr = 'I';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, name, 32768., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TULONG) 
        {
           /* Replace the 'V' with an 'J' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'V') 
              cptr++;

           *cptr = 'J';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, name, 2147483648., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TULONGLONG) 
        {	   
           /* Replace the 'W' with an 'K' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'W') 
              cptr++;

           *cptr = 'K';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, card, status);
           strcat(card, "     ");  /* make sure name is >= 8 chars long */
           *(card+8) = '\0';
	   strcat(card, "=  9223372036854775808 / offset for unsigned integers");
	   fits_write_record(fptr, card, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else
        {
           ffpkys(fptr, name, tfmt, comm, status);
        }

        if (tunit)
        {
         if (tunit[ii] && *(tunit[ii]) ) /* optional TUNITn keyword */
         {
          ffkeyn("TUNIT", ii + 1, name, status);
          ffpkys(fptr, name, tunit[ii],
             "physical unit of field", status);
         }
        }

        if (*status > 0)
            break;       /* abort loop on error */
    }

    if (extnm[0])       /* optional EXTNAME keyword */
        ffpkys(fptr, "EXTNAME", extnm,
               "name of this binary table extension", status);

    if (*status > 0)
        ffpmsg("Failed to write binary table header keywords (ffphbn)");

    return(*status);
}